

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall TaprootScriptTree_TreeTest1_Test::TestBody(TaprootScriptTree_TreeTest1_Test *this)

{
  pointer pBVar1;
  bool bVar2;
  char *pcVar3;
  ScriptBuilder *pSVar4;
  char *in_R9;
  AssertHelper local_dd8;
  Message local_dd0;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_dc8;
  size_type local_db0;
  int local_da4;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar_14;
  Message local_d88;
  Script local_d80;
  string local_d48;
  string local_d28;
  undefined1 local_d08 [8];
  AssertionResult gtest_ar_13;
  allocator local_cd1;
  string local_cd0;
  TaprootScriptTree local_cb0;
  AssertHelper local_c18;
  Message local_c10;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_c08;
  size_type local_bf0;
  int local_be4;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar_12;
  Message local_bc8;
  Script local_bc0;
  string local_b88;
  string local_b68;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_11;
  allocator local_b11;
  string local_b10;
  TaprootScriptTree local_af0;
  AssertHelper local_a58;
  Message local_a50;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_a48;
  size_type local_a30;
  int local_a24;
  undefined1 local_a20 [8];
  AssertionResult gtest_ar_10;
  Message local_a08;
  Script local_a00;
  string local_9c8;
  string local_9a8;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_9;
  allocator local_959;
  string local_958;
  TaprootScriptTree local_938;
  AssertHelper local_8a0;
  Message local_898;
  string local_890;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_8;
  Message local_858;
  ByteData256 local_850;
  string local_838;
  undefined1 local_818 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_7f0;
  Message local_7e8;
  string local_7e0;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_6;
  Message local_7a8;
  ByteData256 local_7a0;
  string local_788;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_5;
  TaprootScriptTree branch;
  Message local_6b8;
  string local_6b0;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_4;
  Message local_678;
  ByteData256 local_670;
  string local_658;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_3;
  Message local_620;
  string local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_2;
  Message local_5e0;
  ByteData256 local_5d8;
  string local_5c0;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_1;
  TaprootScriptTree root;
  char *exp_str;
  char *exp_hash;
  TaprootScriptTree tree3;
  ByteData local_438;
  ScriptBuilder local_420;
  undefined1 local_400 [8];
  Script tree_2_of_2_sig;
  TaprootScriptTree tree2;
  undefined1 local_310 [8];
  Script script_true;
  TaprootScriptTree tree1;
  ScriptBuilder local_228;
  undefined1 local_208 [8];
  Script script;
  SchnorrPubkey schnorr_pubkey3;
  SchnorrPubkey schnorr_pubkey2;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  Message local_158;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_100 [7];
  bool is_parity;
  Pubkey pubkey;
  string local_e0;
  undefined1 local_c0 [8];
  ByteData256 tweak2;
  string local_a0;
  undefined1 local_80 [8];
  ByteData256 tweak1;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootScriptTree_TreeTest1_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)
             ((long)&pubkey.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_100,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_100,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_150,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_130,
             "\"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440\"",
             "schnorr_pubkey.GetHex()",
             (char (*) [65])"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &schnorr_pubkey2.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_170,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string
              ((string *)
               &schnorr_pubkey2.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  cfd::core::SchnorrPubkey::CreateTweakAdd
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_,
             (ByteData256 *)local_80,(bool *)0x0);
  cfd::core::SchnorrPubkey::CreateTweakAdd
            ((SchnorrPubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_
             ,(ByteData256 *)local_c0,(bool *)0x0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_228);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &tree1.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_)
  ;
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (&local_228,
                      (ByteData *)
                      &tree1.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_208,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &tree1.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_228);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_208);
  cfd::core::ScriptBuilder::ScriptBuilder
            ((ScriptBuilder *)
             &tree2.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)
                      &tree2.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_310,pSVar4);
  cfd::core::ScriptBuilder::~ScriptBuilder
            ((ScriptBuilder *)
             &tree2.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_310);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_420);
  cfd::core::SchnorrPubkey::GetData
            (&local_438,
             (SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<(&local_420,&local_438);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &tree3.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ByteData *)
                             &tree3.nodes_.
                              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_400,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &tree3.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData(&local_438);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_420);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&exp_hash,(Script *)local_400);
  exp_str = "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec";
  root.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_1a6c85;
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_5d8,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_5c0,&local_5d8);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_5a0,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  cfd::core::ByteData256::~ByteData256(&local_5d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar2) {
    testing::Message::Message(&local_5e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_618,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_5f8,"exp_str","root.ToString()",
             (char **)&root.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar2) {
    testing::Message::Message(&local_620);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  cfd::core::TaprootScriptTree::operator=
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_670,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_658,&local_670);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_638,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  cfd::core::ByteData256::~ByteData256(&local_670);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar2) {
    testing::Message::Message(&local_678);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x103,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_6b0,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_690,"exp_str","root.ToString()",
             (char **)&root.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar2) {
    testing::Message::Message(&local_6b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &branch.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x104,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &branch.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &branch.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_5.message_,
             (TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_5.message_,
             (TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::operator=
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&gtest_ar_5.message_);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_7a0,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_788,&local_7a0);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_768,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  cfd::core::ByteData256::~ByteData256(&local_7a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar2) {
    testing::Message::Message(&local_7a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x10a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_7e0,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_7c0,"exp_str","root.ToString()",
             (char **)&root.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar2) {
    testing::Message::Message(&local_7e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x10b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f0);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  cfd::core::TaprootScriptTree::operator=
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TapBranch::GetCurrentBranchHash
            ((ByteData256 *)&gtest_ar_7.message_,(TapBranch *)&gtest_ar_5.message_);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(ByteData256 *)&gtest_ar_7.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)&gtest_ar_7.message_);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_850,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_838,&local_850);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_818,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  cfd::core::ByteData256::~ByteData256(&local_850);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar2) {
    testing::Message::Message(&local_858);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x110,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_858);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_890,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char[208],std::__cxx11::string>
            ((EqHelper<false> *)local_870,
             "\"{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
             ,"root.ToString()",
             (char (*) [208])
             "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
             ,&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar2) {
    testing::Message::Message(&local_898);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8a0,&local_898);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  pBVar1 = root.nodes_.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_958,(char *)pBVar1,&local_959);
  gtest_ar_9.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_938,&local_958,(Script *)local_208,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_9.message_,kMainnet);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_1.message_,&local_938);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_938);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_9.message_);
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  cfd::core::Script::GetHex_abi_cxx11_(&local_9a8,(Script *)local_208);
  cfd::core::TapBranch::GetScript(&local_a00,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_9c8,&local_a00);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_988,"script.GetHex()","root.GetScript().GetHex()",&local_9a8,
             &local_9c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  cfd::core::Script::~Script(&local_a00);
  std::__cxx11::string::~string((string *)&local_9a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar2) {
    testing::Message::Message(&local_a08);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x116,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_a08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  local_a24 = 2;
  cfd::core::TapBranch::GetBranchList(&local_a48,(TapBranch *)&gtest_ar_1.message_);
  local_a30 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                        (&local_a48);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_a20,"2","root.GetBranchList().size()",&local_a24,&local_a30);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_a48);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a20);
  if (!bVar2) {
    testing::Message::Message(&local_a50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a20);
    testing::internal::AssertHelper::AssertHelper
              (&local_a58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x117,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a58,&local_a50);
    testing::internal::AssertHelper::~AssertHelper(&local_a58);
    testing::Message::~Message(&local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a20);
  pBVar1 = root.nodes_.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b10,(char *)pBVar1,&local_b11);
  gtest_ar_11.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_11.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_af0,&local_b10,(Script *)local_310,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_11.message_,kMainnet);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_1.message_,&local_af0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_af0);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_11.message_);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_b11);
  cfd::core::Script::GetHex_abi_cxx11_(&local_b68,(Script *)local_310);
  cfd::core::TapBranch::GetScript(&local_bc0,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_b88,&local_bc0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_b48,"script_true.GetHex()","root.GetScript().GetHex()",
             &local_b68,&local_b88);
  std::__cxx11::string::~string((string *)&local_b88);
  cfd::core::Script::~Script(&local_bc0);
  std::__cxx11::string::~string((string *)&local_b68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
  if (!bVar2) {
    testing::Message::Message(&local_bc8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x11a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
  local_be4 = 2;
  cfd::core::TapBranch::GetBranchList(&local_c08,(TapBranch *)&gtest_ar_1.message_);
  local_bf0 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                        (&local_c08);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_be0,"2","root.GetBranchList().size()",&local_be4,&local_bf0);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_c08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar2) {
    testing::Message::Message(&local_c10);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_be0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x11b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c18,&local_c10);
    testing::internal::AssertHelper::~AssertHelper(&local_c18);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  pBVar1 = root.nodes_.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cd0,(char *)pBVar1,&local_cd1);
  gtest_ar_13.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_cb0,&local_cd0,(Script *)local_400,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_,kMainnet);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_1.message_,&local_cb0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_cb0);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  cfd::core::Script::GetHex_abi_cxx11_(&local_d28,(Script *)local_400);
  cfd::core::TapBranch::GetScript(&local_d80,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_d48,&local_d80);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_d08,"tree_2_of_2_sig.GetHex()","root.GetScript().GetHex()",
             &local_d28,&local_d48);
  std::__cxx11::string::~string((string *)&local_d48);
  cfd::core::Script::~Script(&local_d80);
  std::__cxx11::string::~string((string *)&local_d28);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d08);
  if (!bVar2) {
    testing::Message::Message(&local_d88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d08);
  local_da4 = 1;
  cfd::core::TapBranch::GetBranchList(&local_dc8,(TapBranch *)&gtest_ar_1.message_);
  local_db0 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                        (&local_dc8);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_da0,"1","root.GetBranchList().size()",&local_da4,&local_db0);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_dc8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar2) {
    testing::Message::Message(&local_dd0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_da0);
    testing::internal::AssertHelper::AssertHelper
              (&local_dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_dd8,&local_dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_dd8);
    testing::Message::~Message(&local_dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_5.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_1.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&exp_hash);
  cfd::core::Script::~Script((Script *)local_400);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script((Script *)local_310);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script((Script *)local_208);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_100);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_c0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest1) {
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);
  SchnorrPubkey schnorr_pubkey2 = schnorr_pubkey.CreateTweakAdd(tweak1);
  SchnorrPubkey schnorr_pubkey3 = schnorr_pubkey.CreateTweakAdd(tweak2);

  Script script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree1(script);

  Script script_true = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  TaprootScriptTree tree2(script_true);

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script tree_2_of_2_sig = (ScriptBuilder() << schnorr_pubkey2.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey3.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree3(tree_2_of_2_sig);

  auto exp_hash = "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec";
  auto exp_str = "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  TaprootScriptTree root = tree1;
  root.AddBranch(tree2);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  root = tree2;
  root.AddBranch(tree1);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  auto branch = tree2;
  branch.AddBranch(tree1);
  root = tree3;
  root.AddBranch(branch);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  // blind leaf
  root = tree3;
  root.AddBranch(branch.GetCurrentBranchHash());
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(
      "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
      root.ToString());

  root = TaprootScriptTree::FromString(exp_str, script);
  EXPECT_EQ(script.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, script_true);
  EXPECT_EQ(script_true.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, tree_2_of_2_sig);
  EXPECT_EQ(tree_2_of_2_sig.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(1, root.GetBranchList().size());
}